

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O1

int TIFFFillStrip(TIFF *tif,uint32_t strip)

{
  byte *pbVar1;
  uint uVar2;
  uint8_t *puVar3;
  long lVar4;
  int iVar5;
  uint64_t uVar6;
  ulong uVar7;
  tmsize_t bytecountm;
  ulong size;
  
  if ((tif->tif_flags & 0x20000) != 0) {
LAB_002b58b2:
    iVar5 = TIFFStartStrip(tif,strip);
    return iVar5;
  }
  uVar6 = TIFFGetStrileByteCount(tif,strip);
  if ((long)uVar6 < 1) {
    TIFFErrorExtR(tif,"TIFFFillStrip","Invalid strip byte count %lu, strip %u",uVar6,strip);
    return 0;
  }
  size = uVar6;
  if (((0x100000 < uVar6) && (uVar7 = TIFFStripSize(tif), uVar7 != 0)) &&
     (uVar7 < (uVar6 - 0x1000) / 10)) {
    size = uVar7 * 10 + 0x1000;
    TIFFErrorExtR(tif,"TIFFFillStrip","Too large strip byte count %lu, strip %u. Limiting to %lu",
                  uVar6,strip,size);
  }
  if (((tif->tif_flags & 0x800) == 0) ||
     ((size <= (ulong)tif->tif_size &&
      (uVar6 = TIFFGetStrileOffset(tif,strip), uVar6 <= tif->tif_size - size)))) {
    uVar2 = tif->tif_flags;
    if (((uVar2 >> 0xb & 1) != 0) && ((uVar2 & ((tif->tif_dir).td_fillorder | 0x100)) != 0)) {
      if (((uVar2 >> 9 & 1) != 0) && (tif->tif_rawdata != (uint8_t *)0x0)) {
        _TIFFfreeExt(tif,tif->tif_rawdata);
        tif->tif_rawdata = (uint8_t *)0x0;
        tif->tif_rawdatasize = 0;
      }
      pbVar1 = (byte *)((long)&tif->tif_flags + 1);
      *pbVar1 = *pbVar1 & 0xfd;
      tif->tif_rawdatasize = size;
      puVar3 = tif->tif_base;
      uVar6 = TIFFGetStrileOffset(tif,strip);
      tif->tif_rawdata = puVar3 + uVar6;
      tif->tif_rawdataoff = 0;
      tif->tif_rawdataloaded = size;
      pbVar1 = (byte *)((long)&tif->tif_flags + 2);
      *pbVar1 = *pbVar1 | 0x80;
      goto LAB_002b58b2;
    }
    if ((tif->tif_rawdatasize < (long)size) &&
       (tif->tif_curstrip = 0xffffffff, (uVar2 >> 9 & 1) == 0)) {
      TIFFErrorExtR(tif,"TIFFFillStrip","Data buffer too small to hold strip %u",strip);
    }
    else {
      if ((uVar2 >> 0x17 & 1) != 0) {
        tif->tif_curstrip = 0xffffffff;
        tif->tif_rawdata = (uint8_t *)0x0;
        tif->tif_rawdatasize = 0;
        tif->tif_flags = uVar2 & 0xff7fffff;
      }
      if ((tif->tif_flags & 0x800) == 0) {
        uVar7 = TIFFReadRawStripOrTile2(tif,strip,1,size,"TIFFFillStrip");
      }
      else {
        if ((tif->tif_rawdatasize < (long)size) &&
           (iVar5 = TIFFReadBufferSetup(tif,(void *)0x0,size), iVar5 == 0)) {
          return 0;
        }
        uVar7 = TIFFReadRawStrip1(tif,strip,tif->tif_rawdata,size,"TIFFFillStrip");
      }
      if (uVar7 == size) {
        tif->tif_rawdataoff = 0;
        tif->tif_rawdataloaded = size;
        if ((tif->tif_flags & ((tif->tif_dir).td_fillorder | 0x100)) == 0) {
          TIFFReverseBits(tif->tif_rawdata,size);
        }
        goto LAB_002b58b2;
      }
    }
  }
  else {
    lVar4 = tif->tif_size;
    uVar6 = TIFFGetStrileOffset(tif,strip);
    TIFFErrorExtR(tif,"TIFFFillStrip","Read error on strip %u; got %lu bytes, expected %lu",strip,
                  lVar4 - uVar6,size);
    tif->tif_curstrip = 0xffffffff;
  }
  return 0;
}

Assistant:

int TIFFFillStrip(TIFF *tif, uint32_t strip)
{
    static const char module[] = "TIFFFillStrip";
    TIFFDirectory *td = &tif->tif_dir;

    if ((tif->tif_flags & TIFF_NOREADRAW) == 0)
    {
        uint64_t bytecount = TIFFGetStrileByteCount(tif, strip);
        if (bytecount == 0 || bytecount > (uint64_t)TIFF_INT64_MAX)
        {
            TIFFErrorExtR(tif, module,
                          "Invalid strip byte count %" PRIu64
                          ", strip %" PRIu32,
                          bytecount, strip);
            return (0);
        }

        /* To avoid excessive memory allocations: */
        /* Byte count should normally not be larger than a number of */
        /* times the uncompressed size plus some margin */
        if (bytecount > 1024 * 1024)
        {
            /* 10 and 4096 are just values that could be adjusted. */
            /* Hopefully they are safe enough for all codecs */
            tmsize_t stripsize = TIFFStripSize(tif);
            if (stripsize != 0 && (bytecount - 4096) / 10 > (uint64_t)stripsize)
            {
                uint64_t newbytecount = (uint64_t)stripsize * 10 + 4096;
                TIFFErrorExtR(tif, module,
                              "Too large strip byte count %" PRIu64
                              ", strip %" PRIu32 ". Limiting to %" PRIu64,
                              bytecount, strip, newbytecount);
                bytecount = newbytecount;
            }
        }

        if (isMapped(tif))
        {
            /*
             * We must check for overflow, potentially causing
             * an OOB read. Instead of simple
             *
             *  TIFFGetStrileOffset(tif, strip)+bytecount > tif->tif_size
             *
             * comparison (which can overflow) we do the following
             * two comparisons:
             */
            if (bytecount > (uint64_t)tif->tif_size ||
                TIFFGetStrileOffset(tif, strip) >
                    (uint64_t)tif->tif_size - bytecount)
            {
                /*
                 * This error message might seem strange, but
                 * it's what would happen if a read were done
                 * instead.
                 */
                TIFFErrorExtR(
                    tif, module,

                    "Read error on strip %" PRIu32 "; "
                    "got %" PRIu64 " bytes, expected %" PRIu64,
                    strip,
                    NoSanitizeSubUInt64(tif->tif_size,
                                        TIFFGetStrileOffset(tif, strip)),
                    bytecount);
                tif->tif_curstrip = NOSTRIP;
                return (0);
            }
        }

        if (isMapped(tif) && (isFillOrder(tif, td->td_fillorder) ||
                              (tif->tif_flags & TIFF_NOBITREV)))
        {
            /*
             * The image is mapped into memory and we either don't
             * need to flip bits or the compression routine is
             * going to handle this operation itself.  In this
             * case, avoid copying the raw data and instead just
             * reference the data from the memory mapped file
             * image.  This assumes that the decompression
             * routines do not modify the contents of the raw data
             * buffer (if they try to, the application will get a
             * fault since the file is mapped read-only).
             */
            if ((tif->tif_flags & TIFF_MYBUFFER) && tif->tif_rawdata)
            {
                _TIFFfreeExt(tif, tif->tif_rawdata);
                tif->tif_rawdata = NULL;
                tif->tif_rawdatasize = 0;
            }
            tif->tif_flags &= ~TIFF_MYBUFFER;
            tif->tif_rawdatasize = (tmsize_t)bytecount;
            tif->tif_rawdata =
                tif->tif_base + (tmsize_t)TIFFGetStrileOffset(tif, strip);
            tif->tif_rawdataoff = 0;
            tif->tif_rawdataloaded = (tmsize_t)bytecount;

            /*
             * When we have tif_rawdata reference directly into the memory
             * mapped file we need to be pretty careful about how we use the
             * rawdata.  It is not a general purpose working buffer as it
             * normally otherwise is.  So we keep track of this fact to avoid
             * using it improperly.
             */
            tif->tif_flags |= TIFF_BUFFERMMAP;
        }
        else
        {
            /*
             * Expand raw data buffer, if needed, to hold data
             * strip coming from file (perhaps should set upper
             * bound on the size of a buffer we'll use?).
             */
            tmsize_t bytecountm;
            bytecountm = (tmsize_t)bytecount;
            if ((uint64_t)bytecountm != bytecount)
            {
                TIFFErrorExtR(tif, module, "Integer overflow");
                return (0);
            }
            if (bytecountm > tif->tif_rawdatasize)
            {
                tif->tif_curstrip = NOSTRIP;
                if ((tif->tif_flags & TIFF_MYBUFFER) == 0)
                {
                    TIFFErrorExtR(
                        tif, module,
                        "Data buffer too small to hold strip %" PRIu32, strip);
                    return (0);
                }
            }
            if (tif->tif_flags & TIFF_BUFFERMMAP)
            {
                tif->tif_curstrip = NOSTRIP;
                tif->tif_rawdata = NULL;
                tif->tif_rawdatasize = 0;
                tif->tif_flags &= ~TIFF_BUFFERMMAP;
            }

            if (isMapped(tif))
            {
                if (bytecountm > tif->tif_rawdatasize &&
                    !TIFFReadBufferSetup(tif, 0, bytecountm))
                {
                    return (0);
                }
                if (TIFFReadRawStrip1(tif, strip, tif->tif_rawdata, bytecountm,
                                      module) != bytecountm)
                {
                    return (0);
                }
            }
            else
            {
                if (TIFFReadRawStripOrTile2(tif, strip, 1, bytecountm,
                                            module) != bytecountm)
                {
                    return (0);
                }
            }

            tif->tif_rawdataoff = 0;
            tif->tif_rawdataloaded = bytecountm;

            if (!isFillOrder(tif, td->td_fillorder) &&
                (tif->tif_flags & TIFF_NOBITREV) == 0)
                TIFFReverseBits(tif->tif_rawdata, bytecountm);
        }
    }
    return (TIFFStartStrip(tif, strip));
}